

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  size_t sVar1;
  Builder builder_00;
  Builder builder_01;
  void *pvVar2;
  Array<capnp::word> *pAVar3;
  RemoveConst<kj::Array<capnp::word>_> *pRVar4;
  Array<capnp::word> *pAVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  SegmentBuilder *pSVar7;
  SegmentInit *pSVar8;
  ArrayPtr<const_capnp::word> *pAVar9;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar10;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> segments;
  Reader value;
  Fault f;
  int local_2ec;
  PointerBuilder local_2e8;
  Array<capnp::MessageBuilder::SegmentInit> segInits;
  StructBuilder local_2a8;
  Builder local_278;
  WirePointer local_260;
  SegmentBuilder *local_258;
  CapTableBuilder *in_stack_fffffffffffffdb0;
  void *in_stack_fffffffffffffdb8;
  WirePointer *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  SegmentBuilder *in_stack_fffffffffffffdd0;
  TestInitMessageBuilder builder2;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,1,FIXED_SIZE);
  MessageBuilder::getRootInternal((Builder *)&f,&builder.super_MessageBuilder);
  builder2.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)f.exception;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffdd0,(PointerBuilder *)&builder2,
             (StructSize)0x140006,(word *)0x0);
  builder_01._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdb8;
  builder_01._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdb0;
  builder_01._builder.data = in_stack_fffffffffffffdc0;
  builder_01._builder.pointers = (WirePointer *)in_stack_fffffffffffffdc8;
  builder_01._builder._32_8_ = in_stack_fffffffffffffdd0;
  initTestMessage(builder_01);
  AVar10 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  pSVar7 = (SegmentBuilder *)AVar10.size_;
  pAVar6 = AVar10.ptr;
  builder2.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)CONCAT44(builder2.super_MessageBuilder._vptr_MessageBuilder._4_4_,1);
  builder2.super_MessageBuilder.arenaSpace[1] = anon_var_dwarf_71c59;
  builder2.super_MessageBuilder.arenaSpace[2] = &DAT_00000005;
  builder2.super_MessageBuilder.arenaSpace[3]._0_1_ = pSVar7 != (SegmentBuilder *)0x1;
  builder2.super_MessageBuilder.arenaSpace[0] = pSVar7;
  if ((bool)builder2.super_MessageBuilder.arenaSpace[3]._0_1_) {
    segInits.ptr = (SegmentInit *)
                   kj::_::HeapArrayDisposer::allocateImpl
                             (0x18,0,(size_t)pSVar7,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
    pSVar8 = segInits.ptr;
    if (pSVar7 != (SegmentBuilder *)0x0) {
      pAVar9 = pAVar6 + (long)pSVar7;
      do {
        sVar1 = pAVar6->size_;
        (pSVar8->space).ptr = pAVar6->ptr;
        (pSVar8->space).size_ = sVar1;
        pSVar8->wordsUsed = sVar1;
        pSVar8 = pSVar8 + 1;
        pAVar6 = pAVar6 + 1;
      } while (pAVar6 != pAVar9);
    }
    segments.size_ = ((long)pSVar8 - (long)segInits.ptr >> 3) * -0x5555555555555555;
    segInits.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    segments.ptr = segInits.ptr;
    segInits.size_ = segments.size_;
    MessageBuilder::MessageBuilder(&builder2.super_MessageBuilder,segments);
    builder2.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)&PTR__TestInitMessageBuilder_00376e30;
    builder2.allocations.builder.ptr = (Array<capnp::word> *)0x0;
    builder2.allocations.builder.pos = (RemoveConst<kj::Array<capnp::word>_> *)0x0;
    builder2.allocations.builder.endPtr = (Array<capnp::word> *)0x0;
    builder2.allocations.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    MessageBuilder::getRootInternal((Builder *)&local_2a8,&builder2.super_MessageBuilder);
    pvVar2 = local_2a8.data;
    f.exception = (Exception *)local_2a8.segment;
    PointerBuilder::getStruct
              ((StructBuilder *)&local_258,(PointerBuilder *)&f,(StructSize)0x140006,(word *)0x0);
    builder_00._builder.capTable = in_stack_fffffffffffffdb0;
    builder_00._builder.segment = local_258;
    builder_00._builder.data = in_stack_fffffffffffffdb8;
    builder_00._builder.pointers = in_stack_fffffffffffffdc0;
    builder_00._builder.dataSize = (StructDataBitCount)in_stack_fffffffffffffdc8;
    builder_00._builder.pointerCount = SUB82(in_stack_fffffffffffffdc8,4);
    builder_00._builder._38_2_ = SUB82(in_stack_fffffffffffffdc8,6);
    checkTestMessage(builder_00);
    MessageBuilder::getRootInternal((Builder *)&local_2e8,&builder2.super_MessageBuilder);
    local_2a8.data = local_2e8.pointer;
    local_2a8.segment = local_2e8.segment;
    local_2a8.capTable = local_2e8.capTable;
    PointerBuilder::getStruct
              ((StructBuilder *)&f,(PointerBuilder *)&local_2a8,(StructSize)0x140006,(word *)0x0);
    *(undefined8 *)((long)pvVar2 + 8) = 0x1e1b9;
    MessageBuilder::getRootInternal(&local_278,&builder.super_MessageBuilder);
    local_2e8.pointer = local_278.builder.pointer;
    local_2e8.segment = local_278.builder.segment;
    local_2e8.capTable = local_278.builder.capTable;
    PointerBuilder::getStruct(&local_2a8,&local_2e8,(StructSize)0x140006,(word *)0x0);
    f.exception._0_4_ = 0x1e1b9;
    if ((*(WirePointer *)((long)local_2a8.data + 8) != (WirePointer)0x1e1b9) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_2ec = 0x1e1b9;
      MessageBuilder::getRootInternal(&local_278,&builder.super_MessageBuilder);
      local_2e8.pointer = local_278.builder.pointer;
      local_2e8.segment = local_278.builder.segment;
      local_2e8.capTable = local_278.builder.capTable;
      PointerBuilder::getStruct(&local_2a8,&local_2e8,(StructSize)0x140006,(word *)0x0);
      local_260 = *(WirePointer *)((long)local_2a8.data + 8);
      kj::_::Debug::log<char_const(&)[79],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x73,ERROR,
                 "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", _kjCondition, 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
                 ,(char (*) [79])
                  "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())",
                 (DebugComparison<int,_long> *)&f,&local_2ec,(long *)&local_260);
    }
    pSVar7 = (SegmentBuilder *)
             (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr >> 3)
             * -0x5555555555555555);
    f.exception = f.exception & 0xffffffff00000000;
    if ((builder2.allocations.builder.pos != builder2.allocations.builder.ptr) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_2e8.segment = (SegmentBuilder *)((ulong)local_2e8.segment & 0xffffffff00000000);
      local_2a8.segment = pSVar7;
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x76,ERROR,
                 "\"failed: expected \" \"(0) == (builder2.allocations.size())\", _kjCondition, 0, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (0) == (builder2.allocations.size())",
                 (DebugComparison<int,_unsigned_long> *)&f,(int *)&local_2e8,
                 (unsigned_long *)&local_2a8);
    }
    MessageBuilder::getRootInternal((Builder *)&local_2e8,&builder2.super_MessageBuilder);
    local_2a8.data = local_2e8.pointer;
    local_2a8.segment = local_2e8.segment;
    local_2a8.capTable = local_2e8.capTable;
    PointerBuilder::getStruct
              ((StructBuilder *)&f,(PointerBuilder *)&local_2a8,(StructSize)0x140006,(word *)0x0);
    local_2a8.segment = (SegmentBuilder *)f.exception;
    local_2a8.data = &DAT_00000005;
    value.super_StringPtr.content.size_ = 10;
    value.super_StringPtr.content.ptr = "foobarbaz";
    local_2a8.capTable = (CapTableBuilder *)pSVar7;
    PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_2a8,value);
    f.exception._0_4_ = 1;
    if (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr != 0x18) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_2e8.segment = (SegmentBuilder *)CONCAT44(local_2e8.segment._4_4_,1);
      local_2a8.segment =
           (SegmentBuilder *)
           (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr >> 3) *
           -0x5555555555555555);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x78,ERROR,
                 "\"failed: expected \" \"(1) == (builder2.allocations.size())\", _kjCondition, 1, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (1) == (builder2.allocations.size())",
                 (DebugComparison<int,_unsigned_long> *)&f,(int *)&local_2e8,
                 (unsigned_long *)&local_2a8);
    }
    pAVar5 = builder2.allocations.builder.endPtr;
    pRVar4 = builder2.allocations.builder.pos;
    pAVar3 = builder2.allocations.builder.ptr;
    builder2.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)&PTR__TestInitMessageBuilder_00376e30;
    if (builder2.allocations.builder.ptr != (Array<capnp::word> *)0x0) {
      builder2.allocations.builder.ptr = (Array<capnp::word> *)0x0;
      builder2.allocations.builder.pos = (RemoveConst<kj::Array<capnp::word>_> *)0x0;
      builder2.allocations.builder.endPtr = (Array<capnp::word> *)0x0;
      (*(code *)**(undefined8 **)builder2.allocations.builder.disposer)
                (builder2.allocations.builder.disposer,pAVar3,0x18,
                 ((long)pRVar4 - (long)pAVar3 >> 3) * -0x5555555555555555,
                 ((long)pAVar5 - (long)pAVar3 >> 3) * -0x5555555555555555,
                 kj::ArrayDisposer::Dispose_<kj::Array<capnp::word>_>::destruct);
    }
    FlatMessageBuilder::~FlatMessageBuilder((FlatMessageBuilder *)&builder2);
    sVar1 = segInits.size_;
    pSVar8 = segInits.ptr;
    if (segInits.ptr != (SegmentInit *)0x0) {
      segInits.ptr = (SegmentInit *)0x0;
      segInits.size_ = 0;
      (*(code *)**(undefined8 **)segInits.disposer)(segInits.disposer,pSVar8,0x18,sVar1,sVar1,0);
    }
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_2e8.segment = (SegmentBuilder *)CONCAT44(local_2e8.segment._4_4_,1);
  local_2a8.segment = pSVar7;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
             ,0x67,FAILED,"(1) != (segs.size())","_kjCondition,1, segs.size()",
             (DebugComparison<int,_unsigned_long> *)&builder2,(int *)&local_2e8,
             (unsigned_long *)&local_2a8);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Message, MessageBuilderInitMultiSegment) {
  // Same as previous test, but with a message containing many segments.

  MallocMessageBuilder builder(1, AllocationStrategy::FIXED_SIZE);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Pull the segments out and make a segment init table out of them.
  //
  // We const_cast for simplicity of implementing the test, but you shouldn't do that at home. :)
  auto segs = builder.getSegmentsForOutput();
  ASSERT_NE(1, segs.size());

  auto segInits = KJ_MAP(seg, segs) -> MessageBuilder::SegmentInit {
    return { kj::arrayPtr(const_cast<word*>(seg.begin()), seg.size()), seg.size() };
  };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(segInits);
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Force builder2 to allocate new space.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(1, builder2.allocations.size());
}